

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O2

streambuf * __thiscall OB::Term::ostream::streambuf::flush(streambuf *this)

{
  size_type sVar1;
  pointer pcVar2;
  streambuf *psVar3;
  
  sVar1 = (this->_buffer)._M_string_length;
  if (sVar1 != 0) {
    if (this->_size == 0) {
      psVar3 = this->_streambuf;
      pcVar2 = (this->_buffer)._M_dataplus._M_p;
    }
    else {
      if ((this->_white_space == false) && ((this->_buffer)._M_dataplus._M_p[sVar1 - 1] == ' ')) {
        std::__cxx11::string::erase((ulong)&this->_buffer,sVar1 - 1);
      }
      (**(code **)(*(long *)this->_streambuf + 0x60))
                (this->_streambuf,(this->_prefix)._M_dataplus._M_p,(this->_prefix)._M_string_length)
      ;
      psVar3 = this->_streambuf;
      pcVar2 = (this->_buffer)._M_dataplus._M_p;
      sVar1 = (this->_buffer)._M_string_length;
    }
    (**(code **)(*(long *)psVar3 + 0x60))(psVar3,pcVar2,sVar1);
    std::streambuf::sputc((char)this->_streambuf);
  }
  this->_size = 0;
  (this->_buffer)._M_string_length = 0;
  *(this->_buffer)._M_dataplus._M_p = '\0';
  (this->_esc_seq)._M_string_length = 0;
  *(this->_esc_seq)._M_dataplus._M_p = '\0';
  return this;
}

Assistant:

streambuf& flush()
    {
      if (! _buffer.empty())
      {
        if (_size)
        {
          if (! _white_space && ! _buffer.empty() && _buffer.back() == ' ')
          {
            _buffer.erase(_buffer.size() - 1);
          }

          _streambuf->sputn(_prefix.data(), static_cast<std::streamsize>(_prefix.size()));
          _streambuf->sputn(_buffer.data(), static_cast<std::streamsize>(_buffer.size()));
        }
        else
        {
          _streambuf->sputn(_buffer.data(), static_cast<std::streamsize>(_buffer.size()));
        }

        _streambuf->sputc('\n');
      }

      _size = 0;
      _buffer.clear();
      _esc_seq.clear();

      return *this;
    }